

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O1

StructDeclaration * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,StructDeclaration *s)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  Member *m;
  Member *e;
  
  sVar1 = (this->super_RewritingASTVisitor).itemsReplaced;
  sVar2 = (s->members).numActive;
  if (sVar2 != 0) {
    e = (s->members).items;
    lVar3 = sVar2 * 0x28;
    do {
      RewritingASTVisitor::replaceExpression(&this->super_RewritingASTVisitor,&e->type);
      e = e + 1;
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != 0);
  }
  if (sVar1 != (this->super_RewritingASTVisitor).itemsReplaced) {
    AST::StructDeclaration::updateStructureMembers(s);
  }
  return s;
}

Assistant:

AST::StructDeclaration& visit (AST::StructDeclaration& s) override
        {
            auto r = itemsReplaced;
            super::visit (s);

            if (r != itemsReplaced)
                s.updateStructureMembers();

            return s;
        }